

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *coScaleval,
          vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          *scaleval,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *epsilon)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  long lVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  fpclass_type fVar9;
  int iVar10;
  cpp_dec_float<100U,_int,_void> *pcVar11;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar12;
  long lVar13;
  long *plVar14;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  uint local_2c8 [3];
  undefined3 uStack_2bb;
  int iStack_2b8;
  bool bStack_2b4;
  undefined8 local_2b0;
  cpp_dec_float<100U,_int,_void> *local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  uint local_268 [3];
  undefined3 uStack_25b;
  int iStack_258;
  bool bStack_254;
  undefined8 local_250;
  double local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  uint local_208 [3];
  undefined3 uStack_1fb;
  int iStack_1f8;
  bool bStack_1f4;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  uint local_1b8 [3];
  undefined3 uStack_1ab;
  int iStack_1a8;
  bool bStack_1a4;
  undefined8 local_1a0;
  soplex *local_198;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_190;
  long local_188;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  pointer local_88;
  pointer pnStack_80;
  pointer local_78;
  pointer pnStack_70;
  pointer local_68;
  pointer pnStack_60;
  pointer local_58;
  pointer pnStack_50;
  int local_48;
  bool local_44;
  pointer local_40;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[4] = 0;
  (pcVar1->data)._M_elems[5] = 0;
  (pcVar1->data)._M_elems[6] = 0;
  (pcVar1->data)._M_elems[7] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[8] = 0;
  (pcVar1->data)._M_elems[9] = 0;
  (pcVar1->data)._M_elems[10] = 0;
  (pcVar1->data)._M_elems[0xb] = 0;
  pcVar1 = &__return_storage_ptr__->m_backend;
  (pcVar1->data)._M_elems[0xc] = 0;
  (pcVar1->data)._M_elems[0xd] = 0;
  (pcVar1->data)._M_elems[0xe] = 0;
  (pcVar1->data)._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  local_2a0 = &__return_storage_ptr__->m_backend;
  local_190 = coScaleval;
  local_180 = vecset;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < *(int *)(this + 0x38)) {
    local_240 = *(double *)(in_FS_OFFSET + -8);
    local_188 = 0;
    local_198 = this;
    do {
      plVar14 = (long *)((long)*(int *)(*(long *)(local_198 + 0x28) + 4 + local_188 * 8) * 0x28 +
                        *(long *)(local_198 + 0x20));
      local_130._0_4_ = cpp_dec_float_finite;
      local_130._4_4_ = 0x10;
      local_178 = (undefined1  [16])0x0;
      local_168 = (undefined1  [16])0x0;
      local_158 = (undefined1  [16])0x0;
      local_148[0] = 0;
      local_148[1] = 0;
      stack0xfffffffffffffec0 = 0;
      uStack_13b = 0;
      iStack_138 = 0;
      bStack_134 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_178,0.0);
      ::soplex::infinity::__tls_init();
      local_1f0._0_4_ = cpp_dec_float_finite;
      local_1f0._4_4_ = 0x10;
      local_238 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      local_218 = (undefined1  [16])0x0;
      local_208[0] = 0;
      local_208[1] = 0;
      stack0xfffffffffffffe00 = 0;
      uStack_1fb = 0;
      iStack_1f8 = 0;
      bStack_1f4 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_238,local_240);
      if (0 < *(int *)((long)plVar14 + 0xc)) {
        lVar13 = 0;
        lVar12 = 0;
        do {
          lVar3 = *plVar14;
          pcVar11 = (cpp_dec_float<100U,_int,_void> *)
                    ((local_180->
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._vptr_ClassArray + (ulong)*(uint *)(lVar3 + 0x50 + lVar13) * 10);
          pcVar1 = (cpp_dec_float<100U,_int,_void> *)(lVar3 + lVar13);
          local_1a0._0_4_ = cpp_dec_float_finite;
          local_1a0._4_4_ = 0x10;
          local_1e8 = (undefined1  [16])0x0;
          local_1d8 = (undefined1  [16])0x0;
          local_1c8 = (undefined1  [16])0x0;
          local_1b8[0] = 0;
          local_1b8[1] = 0;
          stack0xfffffffffffffe50 = 0;
          uStack_1ab = 0;
          iStack_1a8 = 0;
          bStack_1a4 = false;
          v = pcVar1;
          if (((cpp_dec_float<100U,_int,_void> *)local_1e8 != pcVar11) &&
             (v = pcVar11, pcVar1 != (cpp_dec_float<100U,_int,_void> *)local_1e8)) {
            local_1e8 = *(undefined1 (*) [16])(pcVar1->data)._M_elems;
            local_1d8 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 4);
            local_1c8 = *(undefined1 (*) [16])((pcVar1->data)._M_elems + 8);
            local_1b8._0_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar5 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            stack0xfffffffffffffe50 = (undefined5)uVar5;
            uStack_1ab = (undefined3)((ulong)uVar5 >> 0x28);
            iStack_1a8 = *(int *)(lVar3 + 0x40 + lVar13);
            bStack_1a4 = *(bool *)(lVar3 + 0x44 + lVar13);
            local_1a0 = *(undefined8 *)(lVar3 + 0x48 + lVar13);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_1e8,v);
          local_2c8[0] = local_1b8[0];
          local_2c8[1] = local_1b8[1];
          stack0xfffffffffffffd40 = stack0xfffffffffffffe50;
          uStack_2bb = uStack_1ab;
          local_2d8 = local_1c8;
          local_2e8 = local_1d8;
          local_2f8 = local_1e8;
          auVar6 = local_2f8;
          iStack_2b8 = iStack_1a8;
          bStack_2b4 = bStack_1a4;
          fVar9 = (fpclass_type)local_1a0;
          local_2b0._0_4_ = (fpclass_type)local_1a0;
          local_2b0._4_4_ = local_1a0._4_4_;
          local_2f8._0_4_ = local_1e8._0_4_;
          if ((bStack_1a4 == true) && (local_2f8._0_4_ != 0 || fVar9 != cpp_dec_float_finite)) {
            bStack_2b4 = false;
          }
          local_268[0] = local_1b8[0];
          local_268[1] = local_1b8[1];
          stack0xfffffffffffffda0 = stack0xfffffffffffffe50;
          uStack_25b = uStack_1ab;
          local_278 = local_1c8;
          local_288 = local_1d8;
          local_298 = local_1e8;
          local_88 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pnStack_80 = (scaleval->
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          local_78 = (scaleval->
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          pnStack_70 = scaleval[1].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_68 = scaleval[1].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          pnStack_60 = scaleval[1].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_58 = scaleval[2].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pnStack_50 = scaleval[2].
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_48 = *(int *)&scaleval[2].
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_44 = *(bool *)((long)&scaleval[2].
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          local_40 = scaleval[3].
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          iStack_258 = iStack_1a8;
          bStack_254 = bStack_2b4;
          local_250._0_4_ = (fpclass_type)local_1a0;
          local_250._4_4_ = local_1a0._4_4_;
          if ((bStack_2b4 == true) && (local_2f8._0_4_ != 0 || fVar9 != cpp_dec_float_finite)) {
            bStack_254 = false;
          }
          local_2f8 = auVar6;
          if (((int)local_40 == 2 || fVar9 == cpp_dec_float_NaN) ||
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_298,
                                  (cpp_dec_float<100U,_int,_void> *)&local_88), 0 < iVar10)) {
            if (((fpclass_type)local_2b0 != cpp_dec_float_NaN) &&
               (((fpclass_type)local_130 != cpp_dec_float_NaN &&
                (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    ((cpp_dec_float<100U,_int,_void> *)local_2f8,
                                     (cpp_dec_float<100U,_int,_void> *)local_178), 0 < iVar10)))) {
              local_148[0] = local_2c8[0];
              local_148[1] = local_2c8[1];
              stack0xfffffffffffffec0 = stack0xfffffffffffffd40;
              uStack_13b = uStack_2bb;
              local_158 = local_2d8;
              local_168 = local_2e8;
              local_178 = local_2f8;
              iStack_138 = iStack_2b8;
              bStack_134 = bStack_2b4;
              local_130._0_4_ = (fpclass_type)local_2b0;
              local_130._4_4_ = local_2b0._4_4_;
            }
            if ((((fpclass_type)local_2b0 != cpp_dec_float_NaN) &&
                ((fpclass_type)local_1f0 != cpp_dec_float_NaN)) &&
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)local_2f8,
                                    (cpp_dec_float<100U,_int,_void> *)local_238), iVar10 < 0)) {
              local_208[0] = local_2c8[0];
              local_208[1] = local_2c8[1];
              stack0xfffffffffffffe00 = stack0xfffffffffffffd40;
              uStack_1fb = uStack_2bb;
              local_218 = local_2d8;
              local_228 = local_2e8;
              local_238 = local_2f8;
              iStack_1f8 = iStack_2b8;
              bStack_1f4 = bStack_2b4;
              local_1f0._0_4_ = (fpclass_type)local_2b0;
              local_1f0._4_4_ = local_2b0._4_4_;
            }
          }
          lVar12 = lVar12 + 1;
          lVar13 = lVar13 + 0x54;
        } while (lVar12 < *(int *)((long)plVar14 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_2b0._0_4_ = cpp_dec_float_finite;
      local_2b0._4_4_ = 0x10;
      local_2f8 = (undefined1  [16])0x0;
      local_2e8 = (undefined1  [16])0x0;
      local_2d8 = (undefined1  [16])0x0;
      local_2c8[0] = 0;
      local_2c8[1] = 0;
      stack0xfffffffffffffd40 = 0;
      uStack_2bb = 0;
      iStack_2b8 = 0;
      bStack_2b4 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_2f8,local_240);
      if ((((fpclass_type)local_1f0 == cpp_dec_float_NaN) ||
          ((fpclass_type)local_2b0 == cpp_dec_float_NaN)) ||
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_238,
                              (cpp_dec_float<100U,_int,_void> *)local_2f8), iVar10 != 0)) {
        if ((fpclass_type)local_130 != cpp_dec_float_NaN) {
          local_250._0_4_ = cpp_dec_float_finite;
          local_250._4_4_ = 0x10;
          local_298 = ZEXT816(0);
          local_288 = ZEXT816(0);
          local_278 = ZEXT816(0);
          local_268[0] = 0;
          local_268[1] = 0;
          stack0xfffffffffffffda0 = 0;
          uStack_25b = 0;
          iStack_258 = 0;
          bStack_254 = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)local_298,0.0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_178,
                              (cpp_dec_float<100U,_int,_void> *)local_298);
          if (iVar10 == 0) goto LAB_0014202f;
        }
      }
      else {
LAB_0014202f:
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_238,1.0);
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)local_178,1.0);
      }
      auVar8 = local_218;
      auVar7 = local_228;
      auVar6 = local_238;
      local_128.data._M_elems[0xf]._1_3_ = uStack_1fb;
      local_128.data._M_elems._56_5_ = stack0xfffffffffffffe00;
      local_128.data._M_elems[0xc] = local_208[0];
      local_128.data._M_elems[0xd] = local_208[1];
      local_128.data._M_elems[8] = local_218._0_4_;
      local_128.data._M_elems[9] = local_218._4_4_;
      local_128.data._M_elems[10] = local_218._8_4_;
      local_128.data._M_elems[0xb] = local_218._12_4_;
      local_128.data._M_elems[4] = local_228._0_4_;
      local_128.data._M_elems[5] = local_228._4_4_;
      local_128.data._M_elems[6] = local_228._8_4_;
      local_128.data._M_elems[7] = local_228._12_4_;
      local_128.data._M_elems[0] = local_238._0_4_;
      local_128.data._M_elems[1] = local_238._4_4_;
      local_128.data._M_elems[2] = local_238._8_4_;
      local_128.data._M_elems[3] = local_238._12_4_;
      local_128.exp = iStack_1f8;
      local_128.neg = bStack_1f4;
      local_128.fpclass = (fpclass_type)local_1f0;
      local_128.prec_elem = local_1f0._4_4_;
      local_238 = auVar6;
      local_228 = auVar7;
      local_218 = auVar8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_128,(cpp_dec_float<100U,_int,_void> *)local_178);
      local_d8.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_d8.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_d8.data._M_elems[0xe] = local_128.data._M_elems[0xe];
      local_d8.data._M_elems[0xf] = local_128.data._M_elems[0xf];
      local_d8.data._M_elems[8] = local_128.data._M_elems[8];
      local_d8.data._M_elems[9] = local_128.data._M_elems[9];
      local_d8.data._M_elems[10] = local_128.data._M_elems[10];
      local_d8.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_d8.data._M_elems[4] = local_128.data._M_elems[4];
      local_d8.data._M_elems[5] = local_128.data._M_elems[5];
      local_d8.data._M_elems[6] = local_128.data._M_elems[6];
      local_d8.data._M_elems[7] = local_128.data._M_elems[7];
      local_d8.data._M_elems[0] = local_128.data._M_elems[0];
      local_d8.data._M_elems[1] = local_128.data._M_elems[1];
      local_d8.data._M_elems[2] = local_128.data._M_elems[2];
      local_d8.data._M_elems[3] = local_128.data._M_elems[3];
      local_d8.exp = local_128.exp;
      local_d8.neg = local_128.neg;
      local_d8.fpclass = local_128.fpclass;
      local_d8.prec_elem = local_128.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::calculate_sqrt(&local_d8);
      local_2b0._0_4_ = cpp_dec_float_finite;
      local_2b0._4_4_ = 0x10;
      local_2f8 = ZEXT816(0);
      local_2e8 = ZEXT816(0);
      local_2d8 = ZEXT816(0);
      local_2c8[0] = 0;
      local_2c8[1] = 0;
      stack0xfffffffffffffd40 = 0;
      uStack_2bb = 0;
      iStack_2b8 = 0;
      bStack_2b4 = false;
      local_250._0_4_ = cpp_dec_float_finite;
      local_250._4_4_ = 0x10;
      local_298 = ZEXT816(0);
      local_288 = ZEXT816(0);
      local_278 = ZEXT816(0);
      local_268[0] = 0;
      local_268[1] = 0;
      stack0xfffffffffffffda0 = 0;
      uStack_25b = 0;
      iStack_258 = 0;
      bStack_254 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_298,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_2f8,
                 (cpp_dec_float<100U,_int,_void> *)local_298,&local_d8);
      lVar12 = local_188;
      pnVar4 = (local_190->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (uint *)((long)pnVar4[local_188].m_backend.data._M_elems + 0x30);
      *(undefined8 *)puVar2 = local_2c8._0_8_;
      *(ulong *)(puVar2 + 2) = CONCAT35(uStack_2bb,stack0xfffffffffffffd40);
      puVar2 = (uint *)((long)pnVar4[local_188].m_backend.data._M_elems + 0x20);
      *(undefined8 *)puVar2 = local_2d8._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_2d8._8_8_;
      puVar2 = (uint *)((long)pnVar4[local_188].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar2 = local_2e8._0_8_;
      *(undefined8 *)(puVar2 + 2) = local_2e8._8_8_;
      *(undefined8 *)pnVar4[local_188].m_backend.data._M_elems = local_2f8._0_8_;
      *(undefined8 *)((long)pnVar4[local_188].m_backend.data._M_elems + 8) = local_2f8._8_8_;
      pnVar4[local_188].m_backend.exp = iStack_2b8;
      pnVar4[local_188].m_backend.neg = bStack_2b4;
      pnVar4[local_188].m_backend.fpclass = (fpclass_type)local_2b0;
      pnVar4[local_188].m_backend.prec_elem = local_2b0._4_4_;
      local_250._0_4_ = cpp_dec_float_finite;
      local_250._4_4_ = 0x10;
      local_298 = (undefined1  [16])0x0;
      local_288 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_268[0] = 0;
      local_268[1] = 0;
      stack0xfffffffffffffda0 = 0;
      uStack_25b = 0;
      iStack_258 = 0;
      bStack_254 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_298,
                 (cpp_dec_float<100U,_int,_void> *)local_178,
                 (cpp_dec_float<100U,_int,_void> *)local_238);
      if ((((fpclass_type)local_250 != cpp_dec_float_NaN) &&
          (local_2a0->fpclass != cpp_dec_float_NaN)) &&
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_298,local_2a0), 0 < iVar10)) {
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 0xc)
             = local_268._0_8_;
        *(ulong *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 0xe) =
             CONCAT35(uStack_25b,stack0xfffffffffffffda0);
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 8) =
             local_278._0_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 10)
             = local_278._8_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 4) =
             local_288._0_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 6) =
             local_288._8_8_;
        *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems =
             local_298._0_8_;
        *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_2a0->data)->data)._M_elems + 2) =
             local_298._8_8_;
        local_2a0->exp = iStack_258;
        local_2a0->neg = bStack_254;
        local_2a0->fpclass = (fpclass_type)local_250;
        local_2a0->prec_elem = local_250._4_4_;
      }
      local_188 = lVar12 + 1;
    } while (local_188 < *(int *)(local_198 + 0x38));
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)local_2a0;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}